

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.h
# Opt level: O0

void __thiscall wallet::CWalletTx::Unserialize<DataStream>(CWalletTx *this,DataStream *s)

{
  string_view str;
  string_view str_00;
  TxStateUnrecognized data;
  bool bVar1;
  iterator iVar2;
  long lVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  iterator it_ts;
  iterator it_op;
  int serializedIndex;
  bool dummy_bool;
  vector<wallet::CMerkleTx,_std::allocator<wallet::CMerkleTx>_> dummy_vector2;
  vector<uint256,_std::allocator<uint256>_> dummy_vector1;
  uint256 serialized_block_hash;
  CWalletTx *in_stack_fffffffffffffcd8;
  int index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  ParamsWrapper<TransactionSerParams,_std::shared_ptr<const_CTransaction>_>
  *in_stack_fffffffffffffce0;
  key_type *__x_00;
  TxStateUnrecognized *in_stack_fffffffffffffce8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffcfc;
  allocator<char> *in_stack_fffffffffffffd18;
  char *in_stack_fffffffffffffd20;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  undefined4 local_2b4;
  size_t in_stack_fffffffffffffd50;
  char *in_stack_fffffffffffffd58;
  undefined8 in_stack_fffffffffffffd60;
  undefined8 in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd70;
  undefined4 uVar5;
  undefined4 uStack_28c;
  allocator<char> local_1b4;
  allocator<char> local_1b3;
  allocator<char> local_1b2;
  allocator<char> local_1b1;
  _Base_ptr local_1b0;
  allocator<char> local_1a1;
  _Base_ptr local_1a0;
  _Base_ptr local_198;
  allocator<char> local_189;
  _Base_ptr local_188;
  ParamsWrapper<TransactionSerParams,_std::shared_ptr<const_CTransaction>_> local_180;
  key_type *local_78;
  key_type *pkStack_70;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_68;
  undefined4 local_58;
  size_type local_54;
  size_type sStack_4c;
  undefined8 local_44;
  undefined1 uStack_3c;
  undefined7 uStack_3b;
  undefined1 uStack_34;
  undefined8 uStack_33;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  Init(in_stack_fffffffffffffcd8);
  std::vector<uint256,_std::allocator<uint256>_>::vector
            ((vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffcd8);
  std::vector<wallet::CMerkleTx,_std::allocator<wallet::CMerkleTx>_>::vector
            ((vector<wallet::CMerkleTx,_std::allocator<wallet::CMerkleTx>_> *)
             in_stack_fffffffffffffcd8);
  uint256::uint256((uint256 *)in_stack_fffffffffffffcd8);
  index = (int)((ulong)in_stack_fffffffffffffcd8 >> 0x20);
  local_180 = TransactionSerParams::operator()
                        ((TransactionSerParams *)in_stack_fffffffffffffce8,
                         (shared_ptr<const_CTransaction> *)in_stack_fffffffffffffce0);
  DataStream::operator>>((DataStream *)in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  DataStream::operator>>
            ((DataStream *)in_stack_fffffffffffffce8,(uint256 *)in_stack_fffffffffffffce0);
  DataStream::operator>>
            ((DataStream *)in_stack_fffffffffffffce8,
             (vector<uint256,_std::allocator<uint256>_> *)in_stack_fffffffffffffce0);
  DataStream::operator>>((DataStream *)in_stack_fffffffffffffce8,(int *)in_stack_fffffffffffffce0);
  DataStream::operator>>
            ((DataStream *)in_stack_fffffffffffffce8,
             (vector<wallet::CMerkleTx,_std::allocator<wallet::CMerkleTx>_> *)
             in_stack_fffffffffffffce0);
  DataStream::operator>>
            ((DataStream *)in_stack_fffffffffffffce8,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffce0);
  DataStream::operator>>
            ((DataStream *)in_stack_fffffffffffffce8,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)in_stack_fffffffffffffce0);
  DataStream::operator>>((DataStream *)in_stack_fffffffffffffce8,(uint *)in_stack_fffffffffffffce0);
  DataStream::operator>>((DataStream *)in_stack_fffffffffffffce8,(uint *)in_stack_fffffffffffffce0);
  DataStream::operator>>((DataStream *)in_stack_fffffffffffffce8,(bool *)in_stack_fffffffffffffce0);
  DataStream::operator>>((DataStream *)in_stack_fffffffffffffce8,(bool *)in_stack_fffffffffffffce0);
  TxStateUnrecognized::TxStateUnrecognized
            (in_stack_fffffffffffffce8,(uint256 *)in_stack_fffffffffffffce0,index);
  data.block_hash.super_base_blob<256U>.m_data._M_elems._8_8_ = in_stack_fffffffffffffd58;
  data.block_hash.super_base_blob<256U>.m_data._M_elems[0] = (char)in_stack_fffffffffffffd50;
  data.block_hash.super_base_blob<256U>.m_data._M_elems[1] = (char)(in_stack_fffffffffffffd50 >> 8);
  data.block_hash.super_base_blob<256U>.m_data._M_elems[2] =
       (char)(in_stack_fffffffffffffd50 >> 0x10);
  data.block_hash.super_base_blob<256U>.m_data._M_elems[3] =
       (char)(in_stack_fffffffffffffd50 >> 0x18);
  data.block_hash.super_base_blob<256U>.m_data._M_elems[4] =
       (char)(in_stack_fffffffffffffd50 >> 0x20);
  data.block_hash.super_base_blob<256U>.m_data._M_elems[5] =
       (char)(in_stack_fffffffffffffd50 >> 0x28);
  data.block_hash.super_base_blob<256U>.m_data._M_elems[6] =
       (char)(in_stack_fffffffffffffd50 >> 0x30);
  data.block_hash.super_base_blob<256U>.m_data._M_elems[7] =
       (char)(in_stack_fffffffffffffd50 >> 0x38);
  data.block_hash.super_base_blob<256U>.m_data._M_elems[0x10] = (char)in_stack_fffffffffffffd60;
  data.block_hash.super_base_blob<256U>.m_data._M_elems[0x11] =
       (char)((ulong)in_stack_fffffffffffffd60 >> 8);
  data.block_hash.super_base_blob<256U>.m_data._M_elems[0x12] =
       (char)((ulong)in_stack_fffffffffffffd60 >> 0x10);
  data.block_hash.super_base_blob<256U>.m_data._M_elems[0x13] =
       (char)((ulong)in_stack_fffffffffffffd60 >> 0x18);
  data.block_hash.super_base_blob<256U>.m_data._M_elems[0x14] =
       (char)((ulong)in_stack_fffffffffffffd60 >> 0x20);
  data.block_hash.super_base_blob<256U>.m_data._M_elems[0x15] =
       (char)((ulong)in_stack_fffffffffffffd60 >> 0x28);
  data.block_hash.super_base_blob<256U>.m_data._M_elems[0x16] =
       (char)((ulong)in_stack_fffffffffffffd60 >> 0x30);
  data.block_hash.super_base_blob<256U>.m_data._M_elems[0x17] =
       (char)((ulong)in_stack_fffffffffffffd60 >> 0x38);
  data.block_hash.super_base_blob<256U>.m_data._M_elems[0x18] = (char)in_stack_fffffffffffffd68;
  data.block_hash.super_base_blob<256U>.m_data._M_elems[0x19] =
       (char)((ulong)in_stack_fffffffffffffd68 >> 8);
  data.block_hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
       (char)((ulong)in_stack_fffffffffffffd68 >> 0x10);
  data.block_hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
       (char)((ulong)in_stack_fffffffffffffd68 >> 0x18);
  data.block_hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
       (char)((ulong)in_stack_fffffffffffffd68 >> 0x20);
  data.block_hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
       (char)((ulong)in_stack_fffffffffffffd68 >> 0x28);
  data.block_hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
       (char)((ulong)in_stack_fffffffffffffd68 >> 0x30);
  data.block_hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
       (char)((ulong)in_stack_fffffffffffffd68 >> 0x38);
  data.index = in_stack_fffffffffffffd70;
  TxStateInterpretSerialized(data);
  *(ulong *)((long)&in_RDI[0xe]._M_dataplus._M_p + 1) = CONCAT17(uStack_34,uStack_3b);
  *(undefined8 *)((long)&in_RDI[0xe]._M_string_length + 1) = uStack_33;
  *(undefined8 *)((long)&in_RDI[0xd].field_2 + 8) = local_44;
  in_RDI[0xe]._M_dataplus._M_p = (pointer)CONCAT71(uStack_3b,uStack_3c);
  in_RDI[0xd]._M_string_length = local_54;
  in_RDI[0xd].field_2._M_allocated_capacity = sStack_4c;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  local_188 = (_Base_ptr)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)pkStack_70,local_78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator(&local_189);
  local_198 = (_Base_ptr)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)pkStack_70);
  bVar1 = std::operator==((_Self *)local_68,(_Self *)pkStack_70);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    uVar5 = 0xffffffff;
    uStack_28c = 0xffffffff;
    __x = local_78;
    __x_00 = pkStack_70;
    this_00 = local_68;
    uVar4 = local_58;
  }
  else {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_78);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffcfc,local_58));
    str._M_str = in_stack_fffffffffffffd58;
    str._M_len = in_stack_fffffffffffffd50;
    lVar3 = LocaleIndependentAtoi<long>(str);
    uVar5 = (undefined4)lVar3;
    uStack_28c = (undefined4)((ulong)lVar3 >> 0x20);
    __x = local_78;
    __x_00 = pkStack_70;
    this_00 = local_68;
    uVar4 = local_58;
  }
  *(ulong *)((long)&in_RDI[2].field_2 + 8) = CONCAT44(uStack_28c,uVar5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  iVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)__x_00,__x);
  local_1a0 = iVar2._M_node;
  std::__cxx11::string::~string(__x);
  std::allocator<char>::~allocator(&local_1a1);
  local_1b0 = (_Base_ptr)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)__x_00);
  bVar1 = std::operator==((_Self *)this_00,(_Self *)__x_00);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_2b4 = 0;
  }
  else {
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)__x);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffcfc,uVar4));
    str_00._M_str = (char *)iVar2._M_node;
    str_00._M_len = in_stack_fffffffffffffd50;
    lVar3 = LocaleIndependentAtoi<long>(str_00);
    local_2b4 = (undefined4)lVar3;
  }
  *(undefined4 *)&in_RDI[2].field_2 = local_2b4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::erase(this_00,__x_00);
  std::__cxx11::string::~string(__x);
  std::allocator<char>::~allocator(&local_1b1);
  this_01 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::erase(this_00,__x_00);
  std::__cxx11::string::~string(__x);
  std::allocator<char>::~allocator(&local_1b2);
  __s = &local_1b3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,(allocator<char> *)in_RDI);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::erase(this_00,__x_00);
  std::__cxx11::string::~string(__x);
  std::allocator<char>::~allocator(&local_1b3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_01,(char *)__s,(allocator<char> *)in_RDI);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::erase(this_00,__x_00);
  std::__cxx11::string::~string(__x);
  std::allocator<char>::~allocator(&local_1b4);
  std::vector<wallet::CMerkleTx,_std::allocator<wallet::CMerkleTx>_>::~vector
            ((vector<wallet::CMerkleTx,_std::allocator<wallet::CMerkleTx>_> *)this_00);
  std::vector<uint256,_std::allocator<uint256>_>::~vector
            ((vector<uint256,_std::allocator<uint256>_> *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s)
    {
        Init();

        std::vector<uint256> dummy_vector1; //!< Used to be vMerkleBranch
        std::vector<CMerkleTx> dummy_vector2; //!< Used to be vtxPrev
        bool dummy_bool; //! Used to be fSpent
        uint256 serialized_block_hash;
        int serializedIndex;
        s >> TX_WITH_WITNESS(tx) >> serialized_block_hash >> dummy_vector1 >> serializedIndex >> dummy_vector2 >> mapValue >> vOrderForm >> fTimeReceivedIsTxTime >> nTimeReceived >> fFromMe >> dummy_bool;

        m_state = TxStateInterpretSerialized({serialized_block_hash, serializedIndex});

        const auto it_op = mapValue.find("n");
        nOrderPos = (it_op != mapValue.end()) ? LocaleIndependentAtoi<int64_t>(it_op->second) : -1;
        const auto it_ts = mapValue.find("timesmart");
        nTimeSmart = (it_ts != mapValue.end()) ? static_cast<unsigned int>(LocaleIndependentAtoi<int64_t>(it_ts->second)) : 0;

        mapValue.erase("fromaccount");
        mapValue.erase("spent");
        mapValue.erase("n");
        mapValue.erase("timesmart");
    }